

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::operator==
          (IntercomCommunicationParameters *this,IntercomCommunicationParameters *Value)

{
  KUINT16 KVar1;
  KBOOL KVar2;
  
  KVar1 = this->m_ui16Type;
  if ((KVar1 != Value->m_ui16Type) || (this->m_ui16Length != Value->m_ui16Length)) {
    return false;
  }
  if (KVar1 == 3) {
    KVar2 = GroupAssignmentRecord::operator!=
                      ((GroupAssignmentRecord *)this->m_pRecord,
                       (GroupAssignmentRecord *)Value->m_pRecord);
  }
  else if (KVar1 == 2) {
    KVar2 = GroupDestinationRecord::operator!=
                      ((GroupDestinationRecord *)this->m_pRecord,
                       (GroupDestinationRecord *)Value->m_pRecord);
  }
  else {
    if (KVar1 != 1) {
      return true;
    }
    KVar2 = EntityDestinationRecord::operator!=
                      ((EntityDestinationRecord *)this->m_pRecord,
                       (EntityDestinationRecord *)Value->m_pRecord);
  }
  if (KVar2 == false) {
    return true;
  }
  return false;
}

Assistant:

KBOOL IntercomCommunicationParameters::operator == ( const IntercomCommunicationParameters & Value ) const
{
    if( m_ui16Type   != Value.m_ui16Type )   return false;
    if( m_ui16Length != Value.m_ui16Length ) return false;

    switch( m_ui16Type )
    {
        case EntityDestinationRecord_Type:
        {
            const EntityDestinationRecord *  pl = ( EntityDestinationRecord * )m_pRecord,
                                          *  pr = ( EntityDestinationRecord * )Value.m_pRecord;

            if( *pl != *pr ) return false;
        }
        break;

        case GroupDestinationRecord_Type:
        {
            const GroupDestinationRecord  *  pl = ( GroupDestinationRecord * )m_pRecord,
                                          *  pr = ( GroupDestinationRecord * )Value.m_pRecord;

            if( *pl != *pr ) return false;
        }
        break;

        case GroupAssignmentRecord_Type:
        {
            const GroupAssignmentRecord *  pl = ( GroupAssignmentRecord * )m_pRecord,
                                        *  pr = ( GroupAssignmentRecord * )Value.m_pRecord;

            if( *pl != *pr ) return false;
        }
        break;
    }

    return true;
}